

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

void ncnn::dynamic_quantize_2d_per_h(Mat *blob,Mat *blob_int8,Mat *scales,Option *opt)

{
  char cVar1;
  long lVar2;
  float *pfVar3;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int j_1;
  float scale;
  char *outptr;
  float *ptr_1;
  int i_1;
  int j;
  float absmax;
  float *ptr;
  int i;
  float in_stack_ffffffffffffff50;
  float local_ac;
  int local_a8;
  Allocator *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int iVar4;
  float in_stack_ffffffffffffff7c;
  Mat *in_stack_ffffffffffffff80;
  int local_74;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  Mat::create(in_stack_ffffffffffffff80,(int)in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar4,
              in_stack_ffffffffffffff60);
  Mat::create(in_stack_ffffffffffffff80,(int)in_stack_ffffffffffffff7c,
              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar4,
              in_stack_ffffffffffffff60);
  for (local_74 = 0; local_74 < (int)in_RSI[6]; local_74 = local_74 + 1) {
    lVar2 = *in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)local_74 * in_RDI[2];
    local_ac = 0.0;
    for (iVar4 = 0; iVar4 < *(int *)((long)in_RSI + 0x2c); iVar4 = iVar4 + 1) {
      std::fabs((double)(ulong)*(uint *)(lVar2 + (long)iVar4 * 4));
      pfVar3 = std::max<float>((float *)&stack0xffffffffffffff7c,(float *)&stack0xffffffffffffff74);
      local_ac = *pfVar3;
    }
    if ((local_ac != 0.0) || (NAN(local_ac))) {
      local_ac = 127.0 / local_ac;
    }
    else {
      local_ac = 1.0;
    }
    *(float *)(*in_RDX + (long)local_74 * 4) = local_ac;
  }
  for (iVar4 = 0; iVar4 < (int)in_RSI[6]; iVar4 = iVar4 + 1) {
    lVar2 = *in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)iVar4 * in_RSI[2];
    for (local_a8 = 0; local_a8 < *(int *)((long)in_RSI + 0x2c); local_a8 = local_a8 + 1) {
      cVar1 = float2int8(in_stack_ffffffffffffff50);
      *(char *)(lVar2 + local_a8) = cVar1;
    }
  }
  return;
}

Assistant:

static void dynamic_quantize_2d_per_h(const Mat& blob, Mat& blob_int8, Mat& scales, const Option& opt)
{
    blob_int8.create(blob.w, blob.h, (size_t)1u, 1, opt.workspace_allocator);
    scales.create(blob.h, (size_t)4u, 1, opt.workspace_allocator);

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);

        float absmax = 0.f;
        for (int j = 0; j < blob_int8.w; j++)
        {
            absmax = std::max(absmax, (float)fabs(ptr[j]));
        }

        scales[i] = absmax == 0.f ? 1.f : 127.f / absmax;
    }

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);
        signed char* outptr = blob_int8.row<signed char>(i);
        const float scale = scales[i];

        for (int j = 0; j < blob_int8.w; j++)
        {
            outptr[j] = float2int8(ptr[j] * scale);
        }
    }
}